

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::CopyRow(Matrix *this,int source_row,int destination_row)

{
  pointer pvVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  
  if ((source_row == destination_row) || (this->m_ < 1)) {
    bVar4 = false;
  }
  else {
    lVar5 = 0;
    lVar3 = 0;
    bVar4 = false;
    do {
      pvVar1 = (this->elements_).
               super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = operator!=((Fraction *)
                         (*(long *)&pvVar1[destination_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar5),
                         (Fraction *)
                         (*(long *)&pvVar1[source_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar5));
      if (bVar2) {
        pvVar1 = (this->elements_).
                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)
         (*(long *)&pvVar1[destination_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                    _M_impl.super__Vector_impl_data + lVar5) =
             *(undefined8 *)
              (*(long *)&pvVar1[source_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                         _M_impl.super__Vector_impl_data + lVar5);
        bVar4 = true;
      }
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar3 < this->m_);
  }
  return bVar4;
}

Assistant:

bool Matrix::CopyRow(int source_row, int destination_row) {
  if (source_row == destination_row) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[destination_row][column] != elements_[source_row][column]) {
      result = true;
      elements_[destination_row][column] = elements_[source_row][column];
    }
  }

  return result;
}